

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_http.c
# Opt level: O3

dino_route_t *
list_method_find(dino_route_t *list,dino_http_method method,stack_char_ptr_t *url_stack)

{
  size_t sVar1;
  char **ppcVar2;
  byte *__s1;
  int iVar3;
  size_t sVar4;
  
  if (list != (dino_route_t *)0x0) {
    do {
      if (list->method == method) {
        sVar1 = list->stack->count;
        if (sVar1 == url_stack->count) {
          if (sVar1 == 0) {
            return list;
          }
          ppcVar2 = list->stack->pointers;
          sVar4 = 0;
          while ((__s1 = (byte *)ppcVar2[sVar4], (*__s1 | 0x10) == 0x3a ||
                 (iVar3 = strcmp((char *)__s1,url_stack->pointers[sVar4]), iVar3 == 0))) {
            sVar4 = sVar4 + 1;
            if (sVar1 == sVar4) {
              return list;
            }
          }
        }
      }
      list = list->next;
    } while (list != (dino_route_struct *)0x0);
  }
  return (dino_route_t *)0x0;
}

Assistant:

dino_route_t *list_method_find(dino_route_t *list, dino_http_method method, stack_char_ptr_t *url_stack) {
    bool match = false;

    while (NULL != list) {
        int index = 0;

        if (method == list->method) {
            // Do they have the same number of elements?
            //
            if (list->stack->count == url_stack->count) {
                // Assume that we have a match...
                //
                match = true;

                // Now compare the elements.
                //
                for (; index < list->stack->count && index < url_stack->count; index++) {
                    // If it is a wild card then assume it is good!
                    //
                    if (list->stack->pointers[index][0] == '*') {
                        continue;
                    }

                    // Do we have a :param element?
                    //
                    if (list->stack->pointers[index][0] == ':') {
                        continue;
                    }

                    // Ok see if they are the same string
                    //
                    if (0 != strcmp(list->stack->pointers[index], url_stack->pointers[index])) {
                        match = false;
                        break;
                    }
                }
            }
        }

        if (match) {
            break;
        }

        list = list->next;
    }

    return list;
}